

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_client_request.hxx
# Opt level: O0

void __thiscall nuraft::raft_server::commit_ret_elem::commit_ret_elem(commit_ret_elem *this)

{
  EventAwaiter *in_RDI;
  mutex *pmVar1;
  size_t in_stack_ffffffffffffffe8;
  timer_helper *in_stack_fffffffffffffff0;
  
  pmVar1 = &in_RDI->cvLock;
  EventAwaiter::EventAwaiter(in_RDI);
  timer_helper::timer_helper
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,SUB81((ulong)in_RDI >> 0x38,0));
  std::shared_ptr<nuraft::buffer>::shared_ptr((shared_ptr<nuraft::buffer> *)in_RDI,pmVar1);
  *(undefined4 *)&in_RDI[1].field_0x58 = 0;
  std::
  shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
  ::shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                *)in_RDI,pmVar1);
  in_RDI[2].cvLock.super___mutex_base._M_mutex.__size[8] = '\0';
  return;
}

Assistant:

commit_ret_elem()
        : ret_value_(nullptr)
        , result_code_(cmd_result_code::OK)
        , async_result_(nullptr)
        , callback_invoked_(false)
        {}